

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_behavior(nk_flags *state,nk_rect r,nk_input *i,nk_button_behavior behavior)

{
  nk_rect rect;
  nk_rect rect_00;
  nk_rect b;
  nk_rect rect_01;
  int iVar1;
  int in_EDX;
  nk_input *in_RSI;
  uint *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  int ret;
  undefined4 local_7c;
  undefined4 local_30;
  undefined4 local_4;
  
  rect.y = (float)in_XMM0_Db;
  rect.x = (float)in_XMM0_Da;
  local_30 = 0;
  if ((*in_RDI & 2) == 0) {
    *in_RDI = 4;
  }
  else {
    *in_RDI = 6;
  }
  if (in_RSI == (nk_input *)0x0) {
    local_4 = 0;
  }
  else {
    rect_01._8_8_ = in_XMM1_Qa;
    rect_01.x = (float)in_XMM0_Da;
    rect_01.y = (float)in_XMM0_Db;
    iVar1 = nk_input_is_mouse_hovering_rect(in_RSI,rect_01);
    if (iVar1 != 0) {
      *in_RDI = 0x12;
      iVar1 = nk_input_is_mouse_down(in_RSI,NK_BUTTON_LEFT);
      if (iVar1 != 0) {
        *in_RDI = 0x22;
      }
      b._8_8_ = in_XMM1_Qa;
      b.x = (float)in_XMM0_Da;
      b.y = (float)in_XMM0_Db;
      iVar1 = nk_input_has_mouse_click_in_rect(in_RSI,NK_BUTTON_LEFT,b);
      if (iVar1 != 0) {
        if (in_EDX == 0) {
          local_7c = nk_input_is_mouse_pressed(in_RSI,NK_BUTTON_LEFT);
        }
        else {
          local_7c = nk_input_is_mouse_down(in_RSI,NK_BUTTON_LEFT);
        }
        local_30 = local_7c;
      }
    }
    if (((*in_RDI & 0x10) == 0) ||
       (rect_00._8_8_ = in_XMM1_Qa, rect_00.x = (float)in_XMM0_Da, rect_00.y = (float)in_XMM0_Db,
       iVar1 = nk_input_is_mouse_prev_hovering_rect(in_RSI,rect_00), iVar1 != 0)) {
      rect._8_8_ = in_XMM1_Qa;
      iVar1 = nk_input_is_mouse_prev_hovering_rect(in_RSI,rect);
      if (iVar1 != 0) {
        *in_RDI = *in_RDI | 0x40;
      }
    }
    else {
      *in_RDI = *in_RDI | 8;
    }
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

NK_INTERN int
nk_button_behavior(nk_flags *state, struct nk_rect r,
    const struct nk_input *i, enum nk_button_behavior behavior)
{
    int ret = 0;
    nk_widget_state_reset(state);
    if (!i) return 0;
    if (nk_input_is_mouse_hovering_rect(i, r)) {
        *state = NK_WIDGET_STATE_HOVERED;
        if (nk_input_is_mouse_down(i, NK_BUTTON_LEFT))
            *state = NK_WIDGET_STATE_ACTIVE;
        if (nk_input_has_mouse_click_in_rect(i, NK_BUTTON_LEFT, r)) {
            ret = (behavior != NK_BUTTON_DEFAULT) ?
                nk_input_is_mouse_down(i, NK_BUTTON_LEFT):
#ifdef NK_BUTTON_TRIGGER_ON_RELEASE
                nk_input_is_mouse_released(i, NK_BUTTON_LEFT);
#else
                nk_input_is_mouse_pressed(i, NK_BUTTON_LEFT);
#endif
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(i, r))
        *state |= NK_WIDGET_STATE_LEFT;
    return ret;
}